

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mandelbrot.cpp
# Opt level: O2

int eval_arg<int>(char *s,int min,int max)

{
  long *plVar1;
  runtime_error *this;
  allocator<char> local_1bd;
  int value;
  string local_1b8 [32];
  istringstream in;
  
  std::__cxx11::string::string<std::allocator<char>>(local_1b8,s,&local_1bd);
  std::__cxx11::istringstream::istringstream((istringstream *)&in,local_1b8,_S_in);
  std::__cxx11::string::~string(local_1b8);
  plVar1 = (long *)std::istream::operator>>((istream *)&in,&value);
  if ((((*(byte *)((long)plVar1 + *(long *)(*plVar1 + -0x18) + 0x20) & 5) == 0) && (min <= value))
     && (value <= max)) {
    std::__cxx11::istringstream::~istringstream((istringstream *)&in);
    return value;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this,"invalid value");
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

T eval_arg(const char* s, T min, T max)
{
    T value;
    std::istringstream in{s};

    if (!(in >> value) || value < min || value > max)
        throw std::runtime_error("invalid value");

    return value;
}